

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O0

void __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::RenderDeviceNextGenBase
          (RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           *this,IReferenceCounters *pRefCounters,IMemoryAllocator *RawMemAllocator,
          IEngineFactory *pEngineFactory,size_t CmdQueueCount,ICommandQueueVk **Queues,
          EngineCreateInfo *EngineCI,GraphicsAdapterInfo *AdapterInfo)

{
  IMemoryAllocator *pIVar1;
  int iVar2;
  Char *Message;
  undefined4 extraout_var;
  CommandQueue *this_00;
  RefCntAutoPtr<Diligent::ICommandQueueVk> local_78;
  ulong local_70;
  size_t q;
  undefined1 local_58 [8];
  string msg;
  ICommandQueueVk **Queues_local;
  size_t CmdQueueCount_local;
  IEngineFactory *pEngineFactory_local;
  IMemoryAllocator *RawMemAllocator_local;
  IReferenceCounters *pRefCounters_local;
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  *this_local;
  
  msg.field_2._8_8_ = Queues;
  RenderDeviceBase<Diligent::EngineVkImplTraits>::RenderDeviceBase
            (&this->super_RenderDeviceBase<Diligent::EngineVkImplTraits>,pRefCounters,
             RawMemAllocator,pEngineFactory,EngineCI,AdapterInfo);
  (this->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).
  super_ObjectBase<Diligent::IRenderDeviceVk>.super_RefCountedObject<Diligent::IRenderDeviceVk>.
  super_IRenderDeviceVk.super_IRenderDevice.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_0139c658;
  this->m_CmdQueueCount = CmdQueueCount;
  this->m_CommandQueues = (CommandQueue *)0x0;
  if (0x3f < this->m_CmdQueueCount) {
    FormatString<char[68],unsigned_int,char[2]>
              ((string *)local_58,
               (Diligent *)"The number of command queue is greater than maximum allowed value (",
               (char (*) [68])&MAX_COMMAND_QUEUES,(uint *)0xf65f2d,(char (*) [2])EngineCI);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"RenderDeviceNextGenBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x42);
    std::__cxx11::string::~string((string *)local_58);
  }
  pIVar1 = (this->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_RawMemAllocator;
  iVar2 = (**pIVar1->_vptr_IMemoryAllocator)
                    (pIVar1,this->m_CmdQueueCount * 0x168,
                     "Raw memory for the device command/release queues",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
                     ,0x44);
  this->m_CommandQueues = (CommandQueue *)CONCAT44(extraout_var,iVar2);
  for (local_70 = 0; local_70 < this->m_CmdQueueCount; local_70 = local_70 + 1) {
    this_00 = this->m_CommandQueues + local_70;
    RefCntAutoPtr<Diligent::ICommandQueueVk>::RefCntAutoPtr
              (&local_78,*(ICommandQueueVk **)(msg.field_2._8_8_ + local_70 * 8));
    CommandQueue::CommandQueue
              (this_00,&local_78,
               (this->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_RawMemAllocator);
    RefCntAutoPtr<Diligent::ICommandQueueVk>::~RefCntAutoPtr(&local_78);
  }
  return;
}

Assistant:

RenderDeviceNextGenBase(IReferenceCounters*        pRefCounters,
                            IMemoryAllocator&          RawMemAllocator,
                            IEngineFactory*            pEngineFactory,
                            size_t                     CmdQueueCount,
                            CommandQueueType**         Queues,
                            const EngineCreateInfo&    EngineCI,
                            const GraphicsAdapterInfo& AdapterInfo) :
        TBase{pRefCounters, RawMemAllocator, pEngineFactory, EngineCI, AdapterInfo},
        m_CmdQueueCount{CmdQueueCount}
    {
        VERIFY(m_CmdQueueCount < MAX_COMMAND_QUEUES, "The number of command queue is greater than maximum allowed value (", MAX_COMMAND_QUEUES, ")");

        m_CommandQueues = ALLOCATE(this->m_RawMemAllocator, "Raw memory for the device command/release queues", CommandQueue, m_CmdQueueCount);
        for (size_t q = 0; q < m_CmdQueueCount; ++q)
            new (m_CommandQueues + q) CommandQueue{RefCntAutoPtr<CommandQueueType>(Queues[q]), this->m_RawMemAllocator};
    }